

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O1

ResourceData * __thiscall
Diligent::DeviceObjectArchive::GetResourceData
          (DeviceObjectArchive *this,ResourceType Type,char *Name)

{
  mapped_type *pmVar1;
  key_type local_28;
  
  local_28.Type = Type;
  HashMapStringKey::HashMapStringKey(&local_28.Name,Name,true);
  pmVar1 = std::__detail::
           _Map_base<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_28);
  if ((local_28.Name.Str != (Char *)0x0) && ((long)local_28.Name.Ownership_Hash < 0)) {
    operator_delete__(local_28.Name.Str);
  }
  return pmVar1;
}

Assistant:

ResourceData& GetResourceData(ResourceType Type, const char* Name) noexcept
    {
        constexpr auto MakeCopy = true;
        return m_NamedResources[NamedResourceKey{Type, Name, MakeCopy}];
    }